

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdrex.cpp
# Opt level: O0

SQRex * sqstd_rex_compile(SQAllocContext alloc_ctx,SQChar *pattern,SQChar **error)

{
  int iVar1;
  SQRex *pSVar2;
  size_t sVar3;
  SQRexNode *pSVar4;
  SQInteger SVar5;
  void *pvVar6;
  SQRex *exp_00;
  SQRexMatch *pSVar7;
  SQRex *in_RDX;
  char *in_RSI;
  SQAllocContext in_RDI;
  SQRex *unaff_retaddr;
  SQInteger res;
  SQRex *exp;
  SQChar *in_stack_ffffffffffffffc8;
  SQAllocContext in_stack_ffffffffffffffd0;
  undefined8 in_stack_fffffffffffffff8;
  SQRexNodeType type;
  
  type = (SQRexNodeType)((ulong)in_stack_fffffffffffffff8 >> 0x20);
  pSVar2 = (SQRex *)sq_malloc(in_stack_ffffffffffffffd0,(SQUnsignedInteger)in_stack_ffffffffffffffc8
                             );
  pSVar2->_alloc_ctx = in_RDI;
  pSVar2->_bol = (SQChar *)0x0;
  pSVar2->_eol = (SQChar *)0x0;
  pSVar2->_p = in_RSI;
  sVar3 = strlen(in_RSI);
  pSVar2->_nallocated = sVar3;
  pSVar4 = (SQRexNode *)
           sq_malloc(in_stack_ffffffffffffffd0,(SQUnsignedInteger)in_stack_ffffffffffffffc8);
  pSVar2->_nodes = pSVar4;
  pSVar2->_nsize = 0;
  pSVar2->_matches = (SQRexMatch *)0x0;
  pSVar2->_nsubexpr = 0;
  SVar5 = sqstd_rex_newnode(unaff_retaddr,type);
  pSVar2->_first = SVar5;
  pSVar2->_error = (SQChar **)in_RDX;
  pvVar6 = sq_malloc(in_stack_ffffffffffffffd0,(SQUnsignedInteger)in_stack_ffffffffffffffc8);
  pSVar2->_jmpbuf = pvVar6;
  iVar1 = _setjmp((__jmp_buf_tag *)pSVar2->_jmpbuf);
  if (iVar1 == 0) {
    exp_00 = (SQRex *)sqstd_rex_list(in_RDX);
    pSVar2->_nodes[pSVar2->_first].left = (SQInteger)exp_00;
    if (*pSVar2->_p != '\0') {
      sqstd_rex_error(exp_00,in_stack_ffffffffffffffc8);
    }
    pSVar7 = (SQRexMatch *)
             sq_malloc((SQAllocContext)exp_00,(SQUnsignedInteger)in_stack_ffffffffffffffc8);
    pSVar2->_matches = pSVar7;
    memset(pSVar2->_matches,0,pSVar2->_nsubexpr << 4);
  }
  else {
    sqstd_rex_free((SQRex *)0x1d647a);
    pSVar2 = (SQRex *)0x0;
  }
  return pSVar2;
}

Assistant:

SQRex *sqstd_rex_compile(SQAllocContext alloc_ctx, const SQChar *pattern,const SQChar **error)
{
    SQRex * volatile exp = (SQRex *)sq_malloc(alloc_ctx, sizeof(SQRex)); // "volatile" is needed for setjmp()
    exp->_alloc_ctx = alloc_ctx;
    exp->_eol = exp->_bol = NULL;
    exp->_p = pattern;
    exp->_nallocated = (SQInteger)strlen(pattern) * sizeof(SQChar);
    exp->_nodes = (SQRexNode *)sq_malloc(alloc_ctx, exp->_nallocated * sizeof(SQRexNode));
    exp->_nsize = 0;
    exp->_matches = 0;
    exp->_nsubexpr = 0;
    exp->_first = sqstd_rex_newnode(exp,OP_EXPR);
    exp->_error = error;
    exp->_jmpbuf = sq_malloc(alloc_ctx, sizeof(jmp_buf));
    if(setjmp(*((jmp_buf*)exp->_jmpbuf)) == 0) {
        SQInteger res = sqstd_rex_list(exp);
        exp->_nodes[exp->_first].left = res;
        if(*exp->_p!='\0')
            sqstd_rex_error(exp,_SC("unexpected character"));
#ifdef _DEBUG
        {
            SQInteger nsize,i;
            SQRexNode *t;
            nsize = exp->_nsize;
            t = &exp->_nodes[0];
            printf(_SC("\n"));
            for(i = 0;i < nsize; i++) {
                if(exp->_nodes[i].type>SQ_MAX_CHAR)
                    printf(_SC("[%02d] %10s "), (SQInt32)i,g_nnames[exp->_nodes[i].type-SQ_MAX_CHAR]);
                else
                    printf(_SC("[%02d] %10c "), (SQInt32)i,exp->_nodes[i].type);
                printf(_SC("left %02d right %02d next %02d\n"), (SQInt32)exp->_nodes[i].left, (SQInt32)exp->_nodes[i].right, (SQInt32)exp->_nodes[i].next);
            }
            printf(_SC("\n"));
        }
#endif
        exp->_matches = (SQRexMatch *) sq_malloc(alloc_ctx, exp->_nsubexpr * sizeof(SQRexMatch));
        memset(exp->_matches,0,exp->_nsubexpr * sizeof(SQRexMatch));
    }
    else{
        sqstd_rex_free(exp);
        return NULL;
    }
    return exp;
}